

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageFileExt::~CVmImageFileExt(CVmImageFileExt *this)

{
  _func_int **pp_Var1;
  CVmImageFile *in_RDI;
  CVmImageFileExt_blk *nxt;
  CVmImageFileExt_blk *cur;
  _func_int **local_10;
  
  in_RDI->_vptr_CVmImageFile = (_func_int **)&PTR__CVmImageFileExt_004462f8;
  pp_Var1 = in_RDI[2]._vptr_CVmImageFile;
  while (local_10 = pp_Var1, local_10 != (_func_int **)0x0) {
    pp_Var1 = (_func_int **)*local_10;
    if (local_10 != (_func_int **)0x0) {
      CVmImageFileExt_blk::~CVmImageFileExt_blk((CVmImageFileExt_blk *)0x362557);
      operator_delete(local_10,0x28);
    }
  }
  CVmImageFile::~CVmImageFile(in_RDI);
  return;
}

Assistant:

CVmImageFileExt::~CVmImageFileExt()
{
    CVmImageFileExt_blk *cur;
    CVmImageFileExt_blk *nxt;
    
    /* run through the list of allocated blocks and delete each one */
    for (cur = mem_head_ ; cur != 0 ; cur = nxt)
    {
        /* remember the next block, since we're deleting this one */
        nxt = cur->nxt_;

        /* delete this one */
        delete cur;
    }
}